

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::OurReader::pushError(OurReader *this,Value *value,string *message)

{
  long lVar1;
  size_t sVar2;
  string *in_RDX;
  Value *in_RSI;
  long in_RDI;
  ErrorInfo info;
  Token token;
  size_t length;
  value_type *in_stack_ffffffffffffff48;
  deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_> *this_00;
  string local_70 [32];
  undefined8 local_50;
  undefined4 local_40;
  long lStack_38;
  long local_30;
  ulong local_28;
  string *local_20;
  Value *local_18;
  byte local_1;
  
  local_28 = *(long *)(in_RDI + 200) - *(long *)(in_RDI + 0xc0);
  local_20 = in_RDX;
  local_18 = in_RSI;
  sVar2 = Value::getOffsetStart(in_RSI);
  if (sVar2 <= local_28) {
    sVar2 = Value::getOffsetLimit(local_18);
    if (sVar2 <= local_28) {
      local_40 = 0xd;
      this_00 = *(deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_> **)
                 (in_RDI + 0xc0);
      sVar2 = Value::getOffsetStart(local_18);
      lStack_38 = (long)&(this_00->
                         super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
                         )._M_impl.super__Deque_impl_data._M_map + sVar2;
      lVar1 = *(long *)(in_RDI + 200);
      sVar2 = Value::getOffsetLimit(local_18);
      local_30 = lVar1 + sVar2;
      ErrorInfo::ErrorInfo((ErrorInfo *)0x136414);
      std::__cxx11::string::operator=(local_70,local_20);
      local_50 = 0;
      std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::push_back
                (this_00,in_stack_ffffffffffffff48);
      local_1 = 1;
      ErrorInfo::~ErrorInfo((ErrorInfo *)0x13646f);
      goto LAB_0013648b;
    }
  }
  local_1 = 0;
LAB_0013648b:
  return (bool)(local_1 & 1);
}

Assistant:

bool OurReader::pushError(const Value& value, const std::string& message) {
  size_t length = end_ - begin_;
  if(value.getOffsetStart() > length
    || value.getOffsetLimit() > length)
    return false;
  Token token;
  token.type_ = tokenError;
  token.start_ = begin_ + value.getOffsetStart();
  token.end_ = end_ + value.getOffsetLimit();
  ErrorInfo info;
  info.token_ = token;
  info.message_ = message;
  info.extra_ = 0;
  errors_.push_back(info);
  return true;
}